

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O1

int nni_lmq_put(nni_lmq *lmq,nng_msg *msg)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  int iVar4;
  
  uVar2 = lmq->lmq_len;
  iVar4 = 8;
  if (uVar2 < lmq->lmq_cap) {
    sVar3 = lmq->lmq_put;
    uVar1 = sVar3 + 1;
    lmq->lmq_put = uVar1;
    lmq->lmq_msgs[sVar3] = msg;
    lmq->lmq_len = uVar2 + 1;
    lmq->lmq_put = uVar1 & lmq->lmq_mask;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
nni_lmq_put(nni_lmq *lmq, nng_msg *msg)
{
	if (lmq->lmq_len >= lmq->lmq_cap) {
		return (NNG_EAGAIN);
	}
	lmq->lmq_msgs[lmq->lmq_put++] = msg;
	lmq->lmq_len++;
	lmq->lmq_put &= lmq->lmq_mask;
	return (0);
}